

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  _Bool _Var1;
  undefined8 uVar2;
  ulong local_50;
  size_t n_1;
  uint64_t sum_b10;
  size_t n;
  _Bool local_30 [7];
  _Bool overflow;
  _Bool sum [8];
  _Bool b [8];
  _Bool a [8];
  char **argv_local;
  int argc_local;
  
  printf("Please enter a and b as %d-bit binary numbers\n",8);
  input_binary(b,8,"a = ");
  input_binary(sum,8,"b = ");
  _Var1 = sum_binary(b,sum,8,local_30);
  printf(anon_var_dwarf_61);
  if (_Var1) {
    printf("1");
  }
  for (sum_b10 = 0; sum_b10 < 8; sum_b10 = sum_b10 + 1) {
    uVar2 = 0x30;
    if ((sum[-1 - sum_b10] & 1U) != 0) {
      uVar2 = 0x31;
    }
    printf("%c",uVar2);
  }
  printf("\n");
  n_1 = 0;
  for (local_50 = 0; local_50 < 8; local_50 = local_50 + 1) {
    n_1 = (ulong)(local_30[local_50] & 1) << ((byte)local_50 & 0x3f) | n_1;
  }
  printf("  = %lu\n",n_1);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  bool a[N_BITS];
  bool b[N_BITS];
  bool sum[N_BITS];

  // Input the numbers
  printf("Please enter a and b as %d-bit binary numbers\n", N_BITS);
  input_binary(a, N_BITS, "a = ");
  input_binary(b, N_BITS, "b = ");
  bool overflow = sum_binary(a, b, N_BITS, sum);

  printf("\u03a3 = ");
  // Print the carry bit if necessary
  if (overflow) printf("1");
  // Print each bit (back in big endian)
  for (size_t n = 0; n < N_BITS; n++) {
    printf("%c", sum[N_BITS - n - 1] ? '1' : '0');
  }
  printf("\n");

#if N_BITS <= 64
  // Convert the number in base 10
  uint64_t sum_b10 = 0;
  for (size_t n = 0; n < N_BITS; n++) {
    sum_b10 |= (uint64_t)sum[n] << n;
  }
  printf("  = %" PRIu64 "\n", sum_b10);
#endif

  return 0;
}